

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O3

void __thiscall
Nova::Arg_Data::Arg_Data
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          Vector<double,_3,_true> *default_value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  string local_50;
  
  this->type = VECTOR3;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  (this->val_name)._M_dataplus._M_p = (pointer)&(this->val_name).field_2;
  (this->val_name)._M_string_length = 0;
  (this->val_name).field_2._M_local_buf[0] = '\0';
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  this->boolean_value = false;
  this->integer_default = 0;
  this->integer_value = 0;
  this->double_default = 0.0;
  this->double_value = 0.0;
  (this->vector_2d_default)._data._M_elems[0] = 0.0;
  (this->vector_2d_default)._data._M_elems[1] = 0.0;
  (this->vector_2d_value)._data._M_elems[0] = 0.0;
  (this->vector_2d_value)._data._M_elems[1] = 0.0;
  (this->vector_3d_default)._data._M_elems[2] = (default_value->_data)._M_elems[2];
  dVar4 = (default_value->_data)._M_elems[1];
  (this->vector_3d_default)._data._M_elems[0] = (default_value->_data)._M_elems[0];
  (this->vector_3d_default)._data._M_elems[1] = dVar4;
  uVar1 = *(undefined4 *)((long)(default_value->_data)._M_elems + 4);
  uVar2 = *(undefined4 *)((default_value->_data)._M_elems + 1);
  uVar3 = *(undefined4 *)((long)(default_value->_data)._M_elems + 0xc);
  *(undefined4 *)(this->vector_3d_value)._data._M_elems =
       *(undefined4 *)(default_value->_data)._M_elems;
  *(undefined4 *)((long)(this->vector_3d_value)._data._M_elems + 4) = uVar1;
  *(undefined4 *)((this->vector_3d_value)._data._M_elems + 1) = uVar2;
  *(undefined4 *)((long)(this->vector_3d_value)._data._M_elems + 0xc) = uVar3;
  (this->vector_3d_value)._data._M_elems[2] = (default_value->_data)._M_elems[2];
  (this->string_default)._M_dataplus._M_p = (pointer)&(this->string_default).field_2;
  (this->string_default)._M_string_length = 0;
  (this->string_default).field_2._M_local_buf[0] = '\0';
  (this->string_value)._M_dataplus._M_p = (pointer)&(this->string_value).field_2;
  (this->string_value)._M_string_length = 0;
  (this->string_value).field_2._M_local_buf[0] = '\0';
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"vector3","");
  Initialize(this,input_str,input_val_name,input_desc,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

Arg_Data(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,const Vector<double,3>& default_value)
        :type(VECTOR3),boolean_value(false),integer_default(0),integer_value(0),double_default(0),double_value(0),vector_3d_default(default_value),vector_3d_value(default_value)
    {
        Initialize(input_str,input_val_name,input_desc,"vector3");
    }